

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O3

void uv__fs_readdir_cleanup(uv_fs_t *req)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  undefined8 *puVar4;
  
  if ((undefined8 *)req->ptr != (undefined8 *)0x0) {
    puVar4 = *req->ptr;
    req->ptr = (void *)0x0;
    if ((puVar4 != (undefined8 *)0x0) && (0 < req->result)) {
      piVar2 = __errno_location();
      iVar1 = *piVar2;
      lVar3 = 0;
      do {
        (*(code *)uv__allocator_3)(*puVar4);
        *piVar2 = iVar1;
        *puVar4 = 0;
        lVar3 = lVar3 + 1;
        puVar4 = puVar4 + 2;
      } while (lVar3 < req->result);
    }
  }
  return;
}

Assistant:

void uv__fs_readdir_cleanup(uv_fs_t* req) {
  uv_dir_t* dir;
  uv_dirent_t* dirents;
  int i;

  if (req->ptr == NULL)
    return;

  dir = req->ptr;
  dirents = dir->dirents;
  req->ptr = NULL;

  if (dirents == NULL)
    return;

  for (i = 0; i < req->result; ++i) {
    uv__free((char*) dirents[i].name);
    dirents[i].name = NULL;
  }
}